

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

Matrix<float,_3,_3,_0,_3,_3> *
getSkew<float>(Matrix<float,_3,_3,_0,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_1,_0,_3,_1> *v)

{
  float *s;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar1;
  Scalar local_4c;
  Scalar local_48;
  float local_44;
  Scalar local_40;
  float local_3c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_38;
  
  local_38.m_row = 0;
  local_38.m_col = 1;
  local_38.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = 0.0;
  local_3c = -(v->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_38.m_xpr = __return_storage_ptr__;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_38,&local_3c);
  s = (v->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array + 1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar1,s);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(v->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + 2);
  local_40 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_40);
  local_44 = -(v->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_44);
  local_48 = -*s;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_48);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(Scalar *)v);
  local_4c = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_4c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 3, 3> getSkew(Matrix<floatPrec, 3, 1> v)
{

  Matrix<floatPrec, 3, 3> sV;
  sV << 0, -v(2), v(1),
      v(2), 0, -v(0),
      -v(1), v(0), 0;

  return sV;
}